

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O0

void __thiscall Imf_3_3::Header::erase(Header *this,char *name)

{
  bool bVar1;
  undefined8 uVar2;
  pointer ppVar3;
  char *in_RSI;
  iterator i;
  stringstream _iex_throw_s;
  stringstream *in_stack_fffffffffffffd18;
  Name *in_stack_fffffffffffffd20;
  map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
  *this_00;
  iterator in_stack_fffffffffffffd28;
  _Self local_2b8 [33];
  _Self local_1b0 [3];
  stringstream local_198 [16];
  ostream local_188 [392];
  
  if (*in_RSI != '\0') {
    Name::Name(in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
    local_1b0[0]._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
         ::find((map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
                 *)in_stack_fffffffffffffd18,(key_type *)0x8f775a);
    local_2b8[0]._M_node =
         (_Base_ptr)
         std::
         map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
         ::end((map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
                *)in_stack_fffffffffffffd18);
    bVar1 = std::operator!=(local_1b0,local_2b8);
    if (bVar1) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>::
               operator->((_Rb_tree_iterator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>
                           *)0x8f7796);
      this_00 = (map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
                 *)ppVar3->second;
      if (this_00 !=
          (map<Imf_3_3::Name,_Imf_3_3::Attribute_*,_std::less<Imf_3_3::Name>,_std::allocator<std::pair<const_Imf_3_3::Name,_Imf_3_3::Attribute_*>_>_>
           *)0x0) {
        (*(*(_func_int ***)&(this_00->_M_t)._M_impl)[1])();
      }
      std::
      map<Imf_3_3::Name,Imf_3_3::Attribute*,std::less<Imf_3_3::Name>,std::allocator<std::pair<Imf_3_3::Name_const,Imf_3_3::Attribute*>>>
      ::erase_abi_cxx11_(this_00,in_stack_fffffffffffffd28);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,"Image attribute name cannot be an empty string.");
  uVar2 = __cxa_allocate_exception(0x48);
  Iex_3_3::ArgExc::ArgExc((ArgExc *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  __cxa_throw(uVar2,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
}

Assistant:

void
Header::erase (const char name[])
{
    if (name[0] == 0)
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Image attribute name cannot be an empty string.");

    AttributeMap::iterator i = _map.find (name);
    if (i != _map.end ())
    {
        delete i->second;
        _map.erase (i);
    }
}